

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::
SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>::
emplace<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
          (SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
           *this,unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *args)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> pullLock;
  unique_lock<std::mutex> pushLock;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar2;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  std::unique_lock<std::mutex>::unique_lock
            (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  bVar1 = CLI::std::
          vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ::empty(in_stack_ffffffffffffffc0);
  if (bVar1) {
    std::unique_lock<std::mutex>::unlock(in_RDI);
    std::unique_lock<std::mutex>::unique_lock
              (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    bVar1 = CLI::std::
            vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            ::empty(in_stack_ffffffffffffffc0);
    if (bVar1) {
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                (in_stack_ffffffffffffffc0,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffaf);
    }
    else {
      std::unique_lock<std::mutex>::lock(in_RDI);
    }
    uVar2 = (uint)bVar1;
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
    if (uVar2 != 0) goto LAB_0036e591;
    in_stack_ffffffffffffffbc = 0;
  }
  std::
  vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
  ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
            (in_stack_ffffffffffffffc0,
             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
LAB_0036e591:
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void emplace(Args&&... args)
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                // release the push lock
                pushLock.unlock();
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                if (pullElements.empty()) {
                    pullElements.emplace_back(std::forward<Args>(args)...);
                    queueEmptyFlag = false;
                    return;
                }
                // reengage the push lock so we can push next
                // LCOV_EXCL_START
                pushLock.lock();
                // LCOV_EXCL_STOP
            }
            pushElements.emplace_back(std::forward<Args>(args)...);
        }